

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_list_functions.h
# Opt level: O1

Node<string_tokenizer::Token> *
LinkedList::insert_head<string_tokenizer::Token>(Node<string_tokenizer::Token> **head,Token *item)

{
  pointer pcVar1;
  Node<string_tokenizer::Token> *pNVar2;
  Node<string_tokenizer::Token> *pNVar3;
  
  pNVar3 = *head;
  pNVar2 = (Node<string_tokenizer::Token> *)operator_new(0x30);
  (pNVar2->_item)._token._M_dataplus._M_p = (pointer)&(pNVar2->_item)._token.field_2;
  pcVar1 = (item->_token)._M_dataplus._M_p;
  if (pNVar3 == (Node<string_tokenizer::Token> *)0x0) {
    std::__cxx11::string::_M_construct<char*>
              ((string *)pNVar2,pcVar1,pcVar1 + (item->_token)._M_string_length);
    pNVar3 = (Node<string_tokenizer::Token> *)0x0;
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)pNVar2,pcVar1,pcVar1 + (item->_token)._M_string_length);
  }
  (pNVar2->_item)._type = item->_type;
  pNVar2->_next = pNVar3;
  *head = pNVar2;
  return pNVar2;
}

Assistant:

Node<T>* insert_head(Node<T>*& head, const T& item) {
        Node<T>* node;
        if (head == NULL) {
            node = new Node<T>(item);
            head = node;
        } else {
            node = new Node<T>(item, head);
            head = node;
        }
        return node;
    }